

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

void __thiscall SleighSymbol::restoreXmlHeader(SleighSymbol *this,Element *el)

{
  string *psVar1;
  allocator local_1b1;
  string local_1b0;
  istringstream s;
  uint auStack_178 [90];
  
  std::__cxx11::string::string((string *)&s,"name",(allocator *)&local_1b0);
  Element::getAttributeValue(el,(string *)&s);
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::string((string *)&local_1b0,"id",&local_1b1);
  psVar1 = Element::getAttributeValue(el,&local_1b0);
  std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)psVar1,_S_in);
  std::__cxx11::string::~string((string *)&local_1b0);
  *(uint *)((long)auStack_178 + *(long *)(_s + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(_s + -0x18)) & 0xffffffb5;
  std::istream::_M_extract<unsigned_int>((uint *)&s);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s);
  std::__cxx11::string::string((string *)&local_1b0,"scope",&local_1b1);
  psVar1 = Element::getAttributeValue(el,&local_1b0);
  std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)psVar1,_S_in);
  std::__cxx11::string::~string((string *)&local_1b0);
  *(uint *)((long)auStack_178 + *(long *)(_s + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(_s + -0x18)) & 0xffffffb5;
  std::istream::_M_extract<unsigned_int>((uint *)&s);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s);
  return;
}

Assistant:

void SleighSymbol::restoreXmlHeader(const Element *el)

{
  name = el->getAttributeValue("name");
  {
    istringstream s(el->getAttributeValue("id"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> id;
  }
  {
    istringstream s(el->getAttributeValue("scope"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> scopeid;
  }
}